

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin.cpp
# Opt level: O2

string * __thiscall
flatbuffers::kotlin::KotlinGenerator::GenMethod_abi_cxx11_
          (string *__return_storage_ptr__,KotlinGenerator *this,Type *type)

{
  int iVar1;
  char *__s;
  allocator<char> local_9;
  
  iVar1 = *(int *)&(this->super_BaseGenerator)._vptr_BaseGenerator;
  if (iVar1 - 1U < 0xc) {
    ToSignedType_abi_cxx11_(__return_storage_ptr__,this,type);
  }
  else {
    if (iVar1 == 0xf) {
      __s = "Offset";
      if (*(char *)&(((this->super_BaseGenerator).parser_)->enums_).dict._M_t._M_impl.
                    super__Rb_tree_header._M_header._M_right != '\0') {
        __s = "Struct";
      }
    }
    else {
      __s = "Offset";
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,__s,&local_9);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string GenMethod(const Type &type) {
    return IsScalar(type.base_type) ? ToSignedType(type)
                                    : (IsStruct(type) ? "Struct" : "Offset");
  }